

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint64_t extract_pkg_name(char *path)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  
  sVar2 = strlen(path);
  sVar3 = strlen(path);
  uVar6 = ((int)(uint)sVar3 >> 0x1f & (uint)sVar3) - 1;
  uVar9 = sVar3 & 0xffffffff;
  sVar7 = sVar3;
  do {
    sVar7 = sVar7 - 1;
    sVar8 = sVar3;
    uVar5 = uVar6;
    if ((int)uVar9 < 1) break;
    uVar5 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar5;
  } while (path[sVar7 & 0xffffffff] != '/');
  do {
    sVar8 = sVar8 - 1;
    uVar1 = uVar6;
    if ((int)sVar3 < 1) break;
    uVar1 = (int)sVar3 - 1;
    sVar3 = (size_t)uVar1;
  } while (path[sVar8 & 0xffffffff] != '.');
  uVar6 = 0xffffffff;
  if ((int)uVar5 <= (int)uVar1) {
    uVar6 = uVar1;
  }
  if (uVar5 == 0xffffffff) {
    uVar6 = uVar1;
  }
  sVar7 = sVar2;
  if (((uVar5 & uVar6) != 0xffffffff) && (sVar7 = (size_t)(int)uVar6, uVar5 != 0xffffffff)) {
    if (uVar6 == 0xffffffff) {
      sVar7 = sVar2;
    }
    uVar9 = sVar7 - (long)(int)uVar5;
    if (uVar9 < 2) {
      return 0xffffffffffffffff;
    }
    sVar7 = uVar9 - 1;
    path = path + (long)(int)uVar5 + 1;
  }
  if (sVar7 == 0) {
    uVar4 = 0;
  }
  else {
    sVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 * 0x100000001b3 ^ (ulong)(byte)path[sVar2];
      sVar2 = sVar2 + 1;
    } while (sVar7 != sVar2);
  }
  return uVar4;
}

Assistant:

uint64_t extract_pkg_name(char *path) {
	// Find the last path component
	size_t length = strlen(path);
	int last_path = rfind(path, '/');

	// Find the last `.` for the file extension
	int last_dot = rfind(path, '.');
	if (last_path != -1 && last_dot < last_path) {
		// The dot is before the final path component, so there's no file
		// extension
		last_dot = -1;
	}

	char *start;
	size_t actual_length;
	if (last_path == -1 && last_dot == -1) {
		// No path components and no file extension, the path itself is the name
		start = path;
		actual_length = length;
	} else if (last_path == -1) {
		// File extension, but no path components
		start = path;
		actual_length = (size_t) last_dot;
	} else {
		// Stop before the file extension if one exists
		size_t stop = length;
		if (last_dot != -1) {
			stop = (size_t) last_dot;
		}

		// Extract the last component into a new string
		if (stop - last_path <= 1) {
			return ~((uint64_t) 0);
		}
		start = &path[last_path + 1];
		actual_length = stop - last_path - 1;
	}

	return hash_string(start, actual_length);
}